

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

void Qiniu_Rio_doTask(void *params)

{
  uint blkIdx_00;
  undefined8 uVar1;
  long lVar2;
  Qiniu_Rio_PutExtra *extra_00;
  long *plVar3;
  uint code;
  Qiniu_Retry_Decision QVar4;
  Qiniu_Client *c_00;
  Qiniu_Error QVar5;
  Qiniu_Error err;
  size_t chunksUploaded;
  int tryTimes;
  int blkIdx;
  Qiniu_Client *c;
  Qiniu_Rio_ThreadModel tm;
  Qiniu_Rio_Recorder *recorder;
  Qiniu_Rio_PutExtra *extra;
  Qiniu_Rio_WaitGroup wg;
  Qiniu_Rio_task *task;
  Qiniu_Rio_BlkputRet ret;
  void *params_local;
  
  uVar1 = *(undefined8 *)((long)params + 0x20);
  lVar2 = *(long *)((long)params + 0x28);
  extra_00 = *(Qiniu_Rio_PutExtra **)((long)params + 0x18);
  plVar3 = *(long **)((long)params + 0x30);
  ret._40_8_ = params;
  c_00 = (*((extra_00->threadModel).itbl)->ClientTls)
                   ((extra_00->threadModel).self,*(Qiniu_Client **)((long)params + 0x10));
  blkIdx_00 = *(uint *)((long)params + 0x48);
  chunksUploaded._0_4_ = extra_00->tryTimes;
  err.message = (char *)0x0;
  if (**(long **)((long)params + 0x40) < 1) {
    memset(&task,0,0x30);
    while( true ) {
      Qiniu_Rio_BlkputRet_Assign((Qiniu_Rio_BlkputRet *)&task,extra_00->progresses + (int)blkIdx_00)
      ;
      QVar5 = Qiniu_Rio_ResumableBlockput
                        (c_00,(Qiniu_Rio_BlkputRet *)&task,*params,blkIdx_00,
                         *(int *)((long)params + 0x4c),*(int *)((long)params + 0x50),
                         *(_Qiniu_Uploading_Parts_Progress **)((long)params + 0x58),extra_00,
                         (size_t *)&err.message);
      err._0_8_ = QVar5.message;
      code = QVar5.code;
      if (code == 200) break;
      if (code == 0x26af) {
        Qiniu_Rio_BlkputRet_Cleanup((Qiniu_Rio_BlkputRet *)&task);
        Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
        free(params);
        (**(code **)(lVar2 + 8))(uVar1);
        return;
      }
      if (((int)chunksUploaded < 2) ||
         (QVar4 = _Qiniu_Should_Retry(code), QVar4 == QINIU_DONT_RETRY)) {
        Qiniu_Stderr_Warn("resumable.Put %d failed: %E",(ulong)blkIdx_00,(ulong)code,err._0_8_);
        QVar5._4_4_ = 0;
        QVar5.code = code;
        QVar5.message = (char *)err._0_8_;
        (*extra_00->notifyErr)
                  (extra_00->notifyRecvr,*(int *)((long)params + 0x48),*(int *)((long)params + 0x4c)
                   ,QVar5);
        **(int **)((long)params + 0x38) = **(int **)((long)params + 0x38) + 1;
        goto LAB_00122201;
      }
      chunksUploaded._0_4_ = (int)chunksUploaded + -1;
      Qiniu_Stderr_Info("resumable.Put %E, retrying ...",(ulong)code,err._0_8_);
    }
    Qiniu_Rio_BlkputRet_Assign(extra_00->progresses + (int)blkIdx_00,(Qiniu_Rio_BlkputRet *)&task);
    if (((err.message != (char *)0x0) && (plVar3 != (long *)0x0)) && (*plVar3 != 0)) {
      Qiniu_Rio_Recorder_Write_Medium
                ((Qiniu_Record_Medium *)*plVar3,blkIdx_00,(Qiniu_Rio_BlkputRet *)&task);
    }
LAB_00122201:
    Qiniu_Rio_BlkputRet_Cleanup((Qiniu_Rio_BlkputRet *)&task);
    free(params);
    (**(code **)(lVar2 + 8))(uVar1);
  }
  else {
    free(params);
    Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
    (**(code **)(lVar2 + 8))(uVar1);
  }
  return;
}

Assistant:

static void Qiniu_Rio_doTask(void *params)
{
    Qiniu_Rio_BlkputRet ret;
    Qiniu_Rio_task *task = (Qiniu_Rio_task *)params;
    Qiniu_Rio_WaitGroup wg = task->wg;
    Qiniu_Rio_PutExtra *extra = task->extra;
    Qiniu_Rio_Recorder *recorder = task->recorder;
    Qiniu_Rio_ThreadModel tm = extra->threadModel;
    Qiniu_Client *c = tm.itbl->ClientTls(tm.self, task->mc);
    int blkIdx = task->blkIdx;
    int tryTimes = extra->tryTimes;
    size_t chunksUploaded = 0;

    if ((*task->ninterrupts) > 0)
    {
        free(task);
        Qiniu_Count_Inc(task->ninterrupts);
        wg.itbl->Done(wg.self);
        return;
    }

    memset(&ret, 0, sizeof(ret));

lzRetry:
    Qiniu_Rio_BlkputRet_Assign(&ret, &extra->progresses[blkIdx]);
    Qiniu_Error err = Qiniu_Rio_ResumableBlockput(c, &ret, task->f, blkIdx, task->blkSize1, task->fsize, task->progress, extra, &chunksUploaded);
    if (err.code != 200)
    {
        if (err.code == Qiniu_Rio_PutInterrupted)
        {
            // Terminate the upload process if the caller requests
            Qiniu_Rio_BlkputRet_Cleanup(&ret);
            Qiniu_Count_Inc(task->ninterrupts);
            free(task);
            wg.itbl->Done(wg.self);
            return;
        }

        if (tryTimes > 1 && _Qiniu_Should_Retry(err.code) != QINIU_DONT_RETRY)
        {
            tryTimes--;
            Qiniu_Log_Info("resumable.Put %E, retrying ...", err);
            goto lzRetry;
        }
        Qiniu_Log_Warn("resumable.Put %d failed: %E", blkIdx, err);
        extra->notifyErr(extra->notifyRecvr, task->blkIdx, task->blkSize1, err);
        (*task->nfails)++;
    }
    else
    {
        Qiniu_Rio_BlkputRet_Assign(&extra->progresses[blkIdx], &ret);
        if (chunksUploaded > 0 && recorder != NULL && recorder->recorderMedium != NULL)
        {
            Qiniu_Rio_Recorder_Write_Medium(recorder->recorderMedium, blkIdx, &ret);
        }
    }
    Qiniu_Rio_BlkputRet_Cleanup(&ret);
    free(task);
    wg.itbl->Done(wg.self);
}